

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O3

vector<Quad_*,_std::allocator<Quad_*>_> * __thiscall
Rotation::transform(Rotation *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads)

{
  pointer ppQVar1;
  iterator __position;
  Quad *in_RAX;
  vector<Quad*,std::allocator<Quad*>> *this_00;
  pointer ppQVar2;
  Quad *local_38;
  
  local_38 = in_RAX;
  this_00 = (vector<Quad*,std::allocator<Quad*>> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  ppQVar2 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppQVar1 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppQVar2 != ppQVar1) {
    do {
      local_38 = Quad::getRotatedQuad(*ppQVar2,this->pivotPoint,this->angleRadians);
      __position._M_current = *(Quad ***)(this_00 + 8);
      if (__position._M_current == *(Quad ***)(this_00 + 0x10)) {
        std::vector<Quad*,std::allocator<Quad*>>::_M_realloc_insert<Quad*>
                  (this_00,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      ppQVar2 = ppQVar2 + 1;
    } while (ppQVar2 != ppQVar1);
  }
  return (vector<Quad_*,_std::allocator<Quad_*>_> *)this_00;
}

Assistant:

vector<Quad*>* Rotation::transform(vector<Quad*>* quads) {
    vector<Quad*>* transformedQuads = new vector<Quad*>();
    for (auto quad : *quads) {
        transformedQuads->push_back(quad->getRotatedQuad(pivotPoint, angleRadians));
    }
    return transformedQuads;
}